

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O3

bool DecodeBase58Check(string *str,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet,
                      int max_ret)

{
  char *psz;
  uchar *data;
  uchar *puVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  size_type sVar5;
  int max_ret_len;
  ulong uVar6;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  uint256 result;
  int local_c8 [8];
  CSHA256 local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psz = (str->_M_dataplus)._M_p;
  if (str->_M_string_length != 0) {
    sVar5 = 0;
    do {
      if (psz[sVar5] == '\0') goto LAB_003e6bb9;
      sVar5 = sVar5 + 1;
    } while (str->_M_string_length != sVar5);
  }
  max_ret_len = 0x7fffffff;
  if (max_ret < 0x7ffffffc) {
    max_ret_len = max_ret + 4;
  }
  bVar4 = DecodeBase58(psz,vchRet,max_ret_len);
  data = (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((bVar4) && (uVar6 = (long)puVar1 - (long)data, 3 < uVar6)) {
    local_c8[4] = 0;
    local_c8[5] = 0;
    local_c8[6] = 0;
    local_c8[7] = 0;
    local_c8[0] = 0;
    local_c8[1] = 0;
    local_c8[2] = 0;
    local_c8[3] = 0;
    local_a8.buf[0x30] = '\0';
    local_a8.buf[0x31] = '\0';
    local_a8.buf[0x32] = '\0';
    local_a8.buf[0x33] = '\0';
    local_a8.buf[0x34] = '\0';
    local_a8.buf[0x35] = '\0';
    local_a8.buf[0x36] = '\0';
    local_a8.buf[0x37] = '\0';
    local_a8.buf[0x38] = '\0';
    local_a8.buf[0x39] = '\0';
    local_a8.buf[0x3a] = '\0';
    local_a8.buf[0x3b] = '\0';
    local_a8.buf[0x3c] = '\0';
    local_a8.buf[0x3d] = '\0';
    local_a8.buf[0x3e] = '\0';
    local_a8.buf[0x3f] = '\0';
    local_a8.buf[0x20] = '\0';
    local_a8.buf[0x21] = '\0';
    local_a8.buf[0x22] = '\0';
    local_a8.buf[0x23] = '\0';
    local_a8.buf[0x24] = '\0';
    local_a8.buf[0x25] = '\0';
    local_a8.buf[0x26] = '\0';
    local_a8.buf[0x27] = '\0';
    local_a8.buf[0x28] = '\0';
    local_a8.buf[0x29] = '\0';
    local_a8.buf[0x2a] = '\0';
    local_a8.buf[0x2b] = '\0';
    local_a8.buf[0x2c] = '\0';
    local_a8.buf[0x2d] = '\0';
    local_a8.buf[0x2e] = '\0';
    local_a8.buf[0x2f] = '\0';
    local_a8.buf[0x10] = '\0';
    local_a8.buf[0x11] = '\0';
    local_a8.buf[0x12] = '\0';
    local_a8.buf[0x13] = '\0';
    local_a8.buf[0x14] = '\0';
    local_a8.buf[0x15] = '\0';
    local_a8.buf[0x16] = '\0';
    local_a8.buf[0x17] = '\0';
    local_a8.buf[0x18] = '\0';
    local_a8.buf[0x19] = '\0';
    local_a8.buf[0x1a] = '\0';
    local_a8.buf[0x1b] = '\0';
    local_a8.buf[0x1c] = '\0';
    local_a8.buf[0x1d] = '\0';
    local_a8.buf[0x1e] = '\0';
    local_a8.buf[0x1f] = '\0';
    local_a8.buf[0] = '\0';
    local_a8.buf[1] = '\0';
    local_a8.buf[2] = '\0';
    local_a8.buf[3] = '\0';
    local_a8.buf[4] = '\0';
    local_a8.buf[5] = '\0';
    local_a8.buf[6] = '\0';
    local_a8.buf[7] = '\0';
    local_a8.buf[8] = '\0';
    local_a8.buf[9] = '\0';
    local_a8.buf[10] = '\0';
    local_a8.buf[0xb] = '\0';
    local_a8.buf[0xc] = '\0';
    local_a8.buf[0xd] = '\0';
    local_a8.buf[0xe] = '\0';
    local_a8.buf[0xf] = '\0';
    local_a8.s[4] = 0;
    local_a8.s[5] = 0;
    local_a8.s[6] = 0;
    local_a8.s[7] = 0;
    local_a8.s[0] = 0;
    local_a8.s[1] = 0;
    local_a8.s[2] = 0;
    local_a8.s[3] = 0;
    local_a8.bytes = 0;
    CSHA256::CSHA256(&local_a8);
    CSHA256::Write(&local_a8,data,uVar6 - 4);
    output.m_size = 0x20;
    output.m_data = (uchar *)local_c8;
    CHash256::Finalize((CHash256 *)&local_a8,output);
    puVar2 = (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar4 = local_c8[0] == *(int *)(puVar3 + -4);
    if (bVar4) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (vchRet,(size_type)(puVar3 + (-4 - (long)puVar2)));
    }
    else if (puVar3 != puVar2) {
      (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
  }
  else {
    if (puVar1 != data) {
      (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = data;
    }
LAB_003e6bb9:
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeBase58Check(const std::string& str, std::vector<unsigned char>& vchRet, int max_ret)
{
    if (!ContainsNoNUL(str)) {
        return false;
    }
    return DecodeBase58Check(str.c_str(), vchRet, max_ret);
}